

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.hpp
# Opt level: O1

void __thiscall diy::Master::Proxy::~Proxy(Proxy *this)

{
  _Rb_tree_header *p_Var1;
  IExchangeInfo *pIVar2;
  mapped_type *this_00;
  mapped_type *this_01;
  mapped_type *this_02;
  _Base_ptr p_Var3;
  critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
  *local_48;
  unique_lock<tthread::fast_mutex> local_40;
  
  local_48._0_4_ = this->gid_;
  this_00 = std::
            map<int,_diy::concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>_>
            ::operator[](&this->master_->outgoing_,(key_type *)&local_48);
  local_48 = (critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
              *)CONCAT44(local_48._4_4_,this->gid_);
  this_01 = std::
            map<int,_diy::Master::IncomingRound,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::IncomingRound>_>_>
            ::operator[](&this->master_->incoming_,&this->master_->exchange_round_);
  this_02 = std::
            map<int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>_>
            ::operator[](&this_01->map,(key_type *)&local_48);
  p_Var3 = (this->outgoing_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->outgoing_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    do {
      local_48 = concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
                 ::operator[](this_00,(BlockID *)(p_Var3 + 1));
      local_40._M_device = &local_48->m_;
      local_40._M_owns = false;
      std::unique_lock<tthread::fast_mutex>::lock(&local_40);
      local_40._M_owns = true;
      std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>::
      emplace_back<diy::MemoryBuffer>(&local_48->x_,(MemoryBuffer *)&p_Var3[1]._M_parent);
      if ((local_40._M_owns == true) && (local_40._M_device != (fast_mutex *)0x0)) {
        LOCK();
        (local_40._M_device)->mLock = 0;
        UNLOCK();
        local_40._M_owns = false;
      }
      pIVar2 = this->iexchange_;
      if (pIVar2 != (IExchangeInfo *)0x0) {
        (**(code **)(*(long *)pIVar2 + 0x18))(pIVar2,1);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  if (this->iexchange_ == (IExchangeInfo *)0x0) {
    p_Var3 = (this->incoming_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->incoming_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var3 != p_Var1) {
      do {
        local_48 = concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
                   ::operator[](this_02,(int *)(p_Var3 + 1));
        local_40._M_device = &local_48->m_;
        local_40._M_owns = false;
        std::unique_lock<tthread::fast_mutex>::lock(&local_40);
        local_40._M_owns = true;
        std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>::
        emplace_front<diy::MemoryBuffer>(&local_48->x_,(MemoryBuffer *)&p_Var3[1]._M_parent);
        if ((local_40._M_owns == true) && (local_40._M_device != (fast_mutex *)0x0)) {
          LOCK();
          (local_40._M_device)->mLock = 0;
          UNLOCK();
          local_40._M_owns = false;
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var1);
    }
  }
  std::
  _Rb_tree<diy::BlockID,_std::pair<const_diy::BlockID,_diy::MemoryBuffer>,_std::_Select1st<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
  ::~_Rb_tree(&(this->outgoing_)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_diy::MemoryBuffer>,_std::_Select1st<std::pair<const_int,_diy::MemoryBuffer>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
  ::~_Rb_tree(&(this->incoming_)._M_t);
  return;
}

Assistant:

~Proxy()
    {
        auto& outgoing = master_->outgoing(gid_);
        auto& incoming = master_->incoming(gid_);

        // copy out outgoing_
        for (auto& x : outgoing_)
        {
            outgoing[x.first].access()->emplace_back(std::move(x.second));
            if (iexchange_)
                iexchange_->inc_work();
        }

        // move incoming_ back into master, in case it's a multi-foreach round
        if (!iexchange_)
            for (auto& x : incoming_)
                incoming[x.first].access()->emplace_front(std::move(x.second));
    }